

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsSolve(ARKodeMem ark_mem,N_Vector b,sunrealtype tnow,N_Vector ynow,N_Vector fnow,
              sunrealtype eRNrm,int mnewt)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  sunrealtype resnorm;
  long nps_inc;
  int retval;
  int nli_inc;
  int *jcur;
  int dgamma_fail;
  sunrealtype rwt_mean;
  sunrealtype deltar;
  sunrealtype delta;
  sunrealtype gamrat;
  sunrealtype gamma;
  ARKLsMem arkls_mem;
  sunrealtype bnorm;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  ARKodeMem in_stack_ffffffffffffff68;
  int local_8c;
  int *local_88;
  int local_7c;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  sunrealtype local_58;
  int *local_50;
  double local_48;
  int local_3c;
  double local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ARKodeMem local_10;
  int local_4;
  
  local_3c = in_R8D;
  local_38 = in_XMM1_Qa;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = arkLs_AccessLMem(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_4 == 0) {
    *(undefined8 *)(local_50 + 0x1e) = local_20;
    *(undefined8 *)(local_50 + 0x18) = local_28;
    *(undefined8 *)(local_50 + 0x1a) = local_30;
    if (*local_50 == 0) {
      local_48 = 0.0;
      local_68 = 0.0;
    }
    else {
      local_70 = *(double *)(local_50 + 10) * local_38;
      local_48 = (double)N_VWrmsNorm(local_18,local_10->rwt);
      if (local_48 <= local_70) {
        if (0 < local_3c) {
          N_VConst(0,local_18);
        }
        local_50[0x4c] = 0;
        return local_50[0x4c];
      }
      local_68 = local_70 * *(double *)(local_50 + 0xc);
    }
    if (*(long *)(*(long *)(*(long *)(local_50 + 0xe) + 8) + 0x20) == 0) {
      if (*local_50 != 0) {
        N_VConst(0x3ff0000000000000,*(undefined8 *)(local_50 + 0x16));
        local_78 = (double)N_VWrmsNorm(local_10->rwt,*(undefined8 *)(local_50 + 0x16));
        local_68 = local_68 / local_78;
      }
    }
    else {
      iVar1 = SUNLinSolSetScalingVectors
                        (*(undefined8 *)(local_50 + 0xe),local_10->rwt,local_10->ewt);
      if (iVar1 != 0) {
        arkProcessError(local_10,-0xc,0xd28,"arkLsSolve",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"Error in call to SUNLinSolSetScalingVectors");
        local_50[0x4c] = -0xc;
        return local_50[0x4c];
      }
    }
    N_VConst(0,*(undefined8 *)(local_50 + 0x16));
    iVar1 = SUNLinSolSetZeroGuess(*(undefined8 *)(local_50 + 0xe),1);
    if (iVar1 == 0) {
      if (*(long *)(local_50 + 0x3e) != 0) {
        iVar1 = (**(code **)(local_50 + 0x3e))
                          (local_20,local_28,local_30,*(undefined8 *)(local_50 + 0x44));
        local_50[0x4c] = iVar1;
        *(long *)(local_50 + 0x2e) = *(long *)(local_50 + 0x2e) + 1;
        if (local_50[0x4c] != 0) {
          arkProcessError(local_10,(int)(ulong)(uint)local_50[0x4c],0xd5f,"arkLsSolve",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"The Jacobian x vector setup routine failed in an unrecoverable manner.")
          ;
          return local_50[0x4c];
        }
      }
      iVar1 = SUNLinSolSolve(local_68,*(undefined8 *)(local_50 + 0xe),
                             *(undefined8 *)(local_50 + 0x10),*(undefined8 *)(local_50 + 0x16),
                             local_18);
      N_VScale(0x3ff0000000000000,*(undefined8 *)(local_50 + 0x16),local_18);
      if (local_50[9] != 0) {
        iVar2 = (*local_10->step_getgammas)(local_10,&local_58,&local_60,&local_88,&local_7c);
        local_50[0x4c] = iVar2;
        if (local_50[0x4c] != 0) {
          arkProcessError(local_10,(int)(ulong)(uint)local_50[0x4c],0xd73,"arkLsSolve",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"An error occurred in ark_step_getgammas");
          return local_50[0x4c];
        }
        if ((local_60 != 1.0) || (NAN(local_60))) {
          N_VScale(2.0 / (local_60 + 1.0),local_18,local_18);
        }
      }
      local_8c = 0;
      if (*local_50 != 0) {
        if (*(long *)(*(long *)(*(long *)(local_50 + 0xe) + 8) + 0x50) != 0) {
          SUNLinSolResNorm(*(undefined8 *)(local_50 + 0xe));
        }
        if (*(long *)(*(long *)(*(long *)(local_50 + 0xe) + 8) + 0x48) != 0) {
          local_8c = SUNLinSolNumIters(*(undefined8 *)(local_50 + 0xe));
        }
      }
      *(long *)(local_50 + 0x28) = (long)local_8c + *(long *)(local_50 + 0x28);
      if (iVar1 != 0) {
        *(long *)(local_50 + 0x2c) = *(long *)(local_50 + 0x2c) + 1;
      }
      local_50[0x4c] = iVar1;
      if ((1 < iVar1 + 9999U) && (iVar1 != -0x2705)) {
        if (iVar1 == -0x2703) {
          arkProcessError(local_10,-0x2703,0xdac,"arkLsSolve",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"Failure in SUNLinSol external package");
          return -1;
        }
        if (1 < iVar1 + 0x32bU) {
          if (iVar1 == -0x328) {
            arkProcessError(local_10,-0x328,0xdb6,"arkLsSolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"The preconditioner solve routine failed in an unrecoverable manner.");
            return -1;
          }
          if (iVar1 == -0x325) {
            arkProcessError(local_10,-0x325,0xdb1,"arkLsSolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"The Jacobian x vector routine failed in an unrecoverable manner.");
            return -1;
          }
          if (iVar1 == 0) {
            return 0;
          }
          if (iVar1 != 0x321) {
            if ((1 < iVar1 - 0x322U) && (3 < iVar1 - 0x325U)) {
              return 0;
            }
            return 1;
          }
          if (local_3c == 0) {
            return 0;
          }
          return 1;
        }
      }
      local_4 = -1;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int arkLsSolve(ARKodeMem ark_mem, N_Vector b, sunrealtype tnow, N_Vector ynow,
               N_Vector fnow, sunrealtype eRNrm, int mnewt)
{
  sunrealtype bnorm;
  ARKLsMem arkls_mem;
  sunrealtype gamma, gamrat, delta, deltar, rwt_mean;
  sunbooleantype dgamma_fail, *jcur;
  int nli_inc, retval;

  /* used when logging is enabled */
  SUNDIALS_MAYBE_UNUSED long int nps_inc;
  SUNDIALS_MAYBE_UNUSED sunrealtype resnorm;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set scalar tcur and vectors ycur and fcur for use by the
     Atimes and Psolve interface routines */
  arkls_mem->tcur = tnow;
  arkls_mem->ycur = ynow;
  arkls_mem->fcur = fnow;

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (arkls_mem->iterative)
  {
    deltar = arkls_mem->eplifac * eRNrm;
    bnorm  = N_VWrmsNorm(b, ark_mem->rwt);

    SUNLogInfo(ARK_LOGGER, "begin-linear-solve",
               "iterative = 1, b-norm = %.16g, b-tol = %.16g, res-tol = %.16g",
               bnorm, deltar, deltar * arkls_mem->nrmfac);

    if (bnorm <= deltar)
    {
      if (mnewt > 0) { N_VConst(ZERO, b); }
      arkls_mem->last_flag = ARKLS_SUCCESS;

      SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = success small rhs",
                 "");

      return (arkls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * arkls_mem->nrmfac;
  }
  else
  {
    delta = bnorm = ZERO;

    SUNLogInfo(ARK_LOGGER, "begin-linear-solve", "iterative = 0");
  }

  /* Set scaling vectors for LS to use (if applicable) */
  if (arkls_mem->LS->ops->setscalingvectors)
  {
    retval = SUNLinSolSetScalingVectors(arkls_mem->LS, ark_mem->rwt,
                                        ark_mem->ewt);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in call to SUNLinSolSetScalingVectors");
      arkls_mem->last_flag = ARKLS_SUNLS_FAIL;

      SUNLogInfo(ARK_LOGGER, "end-linear-solve",
                 "status = failed set scaling vectors");

      return (arkls_mem->last_flag);
    }

    /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for ewt/rwt vectors.  We make the
     following assumptions:
       1. rwt_i = rwt_mean, for i=0,...,n-1 (i.e. the residual units are identical)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(rwt)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (rwt_i (b - A x)_i)^2 < tol^2
       <=> rwt_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / rwt_mean^2
       <=> || b - A x ||_2 < tol / rwt_mean
     So we compute rwt_mean = ||rwt||_RMS and scale the desired tolerance accordingly. */
  }
  else if (arkls_mem->iterative)
  {
    N_VConst(ONE, arkls_mem->x);
    rwt_mean = N_VWrmsNorm(ark_mem->rwt, arkls_mem->x);
    delta /= rwt_mean;
  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, arkls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(arkls_mem->LS, SUNTRUE);
  if (retval != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = failed set zero guess",
               "");
    return (-1);
  }

  /* Store previous nps value in nps_inc */
  nps_inc = arkls_mem->nps;

  /* If a user-provided jtsetup routine is supplied, call that here */
  if (arkls_mem->jtsetup)
  {
    arkls_mem->last_flag = arkls_mem->jtsetup(tnow, ynow, fnow,
                                              arkls_mem->Jt_data);
    arkls_mem->njtsetup++;
    if (arkls_mem->last_flag)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, MSG_LS_JTSETUP_FAILED);

      SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = failed J-times setup");
      return (arkls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(arkls_mem->LS, arkls_mem->A, arkls_mem->x, b, delta);
  N_VScale(ONE, arkls_mem->x, b);

  /* If using a direct or matrix-iterative solver, scale the correction to
     account for change in gamma (this is only beneficial if M==I) */
  if (arkls_mem->scalesol)
  {
    arkls_mem->last_flag = ark_mem->step_getgammas(ark_mem, &gamma, &gamrat,
                                                   &jcur, &dgamma_fail);
    if (arkls_mem->last_flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, "An error occurred in ark_step_getgammas");
      return (arkls_mem->last_flag);
    }
    if (gamrat != ONE) { N_VScale(TWO / (ONE + gamrat), b, b); }
  }

  /* Retrieve statistics from iterative linear solvers */
  resnorm = ZERO;
  nli_inc = 0;
  if (arkls_mem->iterative)
  {
    if (arkls_mem->LS->ops->resnorm)
    {
      resnorm = SUNLinSolResNorm(arkls_mem->LS);
    }
    if (arkls_mem->LS->ops->numiters)
    {
      nli_inc = SUNLinSolNumIters(arkls_mem->LS);
    }
  }

  /* Increment counters nli and ncfl */
  arkls_mem->nli += nli_inc;
  if (retval != SUN_SUCCESS) { arkls_mem->ncfl++; }

  /* Interpret solver return value  */
  arkls_mem->last_flag = retval;

  SUNLogInfoIf(retval == SUN_SUCCESS, ARK_LOGGER, "end-linear-solve",
               "status = success, iters = %i, p-solves = %i, resnorm = %.16g",
               nli_inc, (int)(arkls_mem->nps - nps_inc), resnorm);
  SUNLogInfoIf(retval != SUN_SUCCESS, ARK_LOGGER,
               "end-linear-solve", "status = failed, retval = %i, iters = %i, p-solves = %i, resnorm = %.16g",
               retval, nli_inc, (int)(arkls_mem->nps - nps_inc), resnorm);

  switch (retval)
  {
  case SUN_SUCCESS: return (0); break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first nonlinear iteration,
       otherwise return with a recoverable failure */
    if (mnewt == 0) { return (0); }
    else { return (1); }
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL: return (1); break;
  case SUN_ERR_ARG_CORRUPT:
  case SUN_ERR_ARG_INCOMPATIBLE:
  case SUN_ERR_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL: return (-1); break;
  case SUN_ERR_EXT_FAIL:
    arkProcessError(ark_mem, SUN_ERR_EXT_FAIL, __LINE__, __func__, __FILE__,
                    "Failure in SUNLinSol external package");
    return (-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    arkProcessError(ark_mem, SUNLS_ATIMES_FAIL_UNREC, __LINE__, __func__,
                    __FILE__, MSG_LS_JTIMES_FAILED);
    return (-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    arkProcessError(ark_mem, SUNLS_PSOLVE_FAIL_UNREC, __LINE__, __func__,
                    __FILE__, MSG_LS_PSOLVE_FAILED);
    return (-1);
    break;
  }

  return (0);
}